

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O2

TestRegistry * TestRegistry::getCurrentRegistry(void)

{
  int iVar1;
  TestRegistry *pTVar2;
  
  if (getCurrentRegistry()::registry == '\0') {
    iVar1 = __cxa_guard_acquire(&getCurrentRegistry()::registry);
    if (iVar1 != 0) {
      TestRegistry(&getCurrentRegistry::registry);
      __cxa_guard_release(&getCurrentRegistry()::registry);
    }
  }
  pTVar2 = &getCurrentRegistry::registry;
  if (currentRegistry_ != (TestRegistry *)0x0) {
    pTVar2 = currentRegistry_;
  }
  return pTVar2;
}

Assistant:

TestRegistry* TestRegistry::getCurrentRegistry()
{
    static TestRegistry registry;
    return (currentRegistry_ == NULLPTR) ? &registry : currentRegistry_;
}